

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_matvec_multiply(Integer s_a,Integer g_a,Integer g_v)

{
  double *pdVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  Integer IVar14;
  void *pvVar15;
  undefined8 *buf;
  void *buf_00;
  undefined8 *puVar16;
  Integer IVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  Integer khi;
  Integer klo;
  long local_138;
  long local_130;
  Integer local_128;
  Integer one;
  Integer jhi;
  Integer jlo;
  int *jptr;
  int *iptr;
  int64_t *jlptr;
  int64_t *ilptr;
  long local_e8;
  Integer local_e0;
  Integer local_d8;
  void *vptr;
  Integer local_c8;
  Integer local_c0;
  Integer local_b8;
  long local_b0;
  ulong local_a8;
  Integer vtype;
  Integer atype;
  Integer vrank;
  double one_r;
  Integer arank;
  Integer ihi;
  Integer ilo;
  Integer dims [7];
  
  lVar25 = s_a + 1000;
  IVar17 = SPA[lVar25].grp;
  local_128 = g_a;
  local_c8 = s_a;
  local_d8 = pnga_pgroup_nodeid(IVar17);
  local_e0 = pnga_pgroup_nnodes(IVar17);
  local_a8 = (ulong)(uint)SPA[lVar25].idx_size;
  ilptr = (int64_t *)0x0;
  jlptr = (int64_t *)0x0;
  iptr = (int *)0x0;
  jptr = (int *)0x0;
  one_r = 1.0;
  one = 1;
  local_130 = (long)_ga_sync_begin;
  lVar18 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  local_e8 = lVar25 * 200;
  if (local_130 != 0) {
    pnga_pgroup_sync(IVar17);
  }
  local_b8 = IVar17;
  pnga_inquire(local_128,&atype,&arank,dims);
  lVar25 = dims[0];
  pnga_inquire(g_v,&vtype,&vrank,dims);
  if (arank != 1) {
    pnga_error("rank of A must be 1 (vector)",arank);
  }
  if (vrank != 1) {
    pnga_error("rank of V must be 1 (vector)",vrank);
  }
  lVar20 = local_e8;
  if (lVar25 != *(long *)((long)&SPA->jdim + local_e8)) {
    pnga_error("length of A must equal second dimension of sparse matrix",lVar25);
    lVar25 = *(long *)((long)&SPA->jdim + lVar20);
  }
  if (dims[0] != lVar25) {
    pnga_error("length of V must equal second dimension of sparse matrix",dims[0]);
  }
  lVar20 = local_e8;
  lVar25 = *(long *)((long)&SPA->type + local_e8);
  if ((atype != lVar25) || (vtype != lVar25)) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",lVar25);
    atype = *(long *)((long)&SPA->type + lVar20);
  }
  if (atype == 0x3f8) {
    pnga_error("Data type of sparse matrix and A and V vectors cannot be of type long long",0x3f8);
  }
  local_b0 = lVar18;
  pnga_mask_sync(local_130,lVar18);
  local_c0 = g_v;
  pnga_zero(g_v);
  pnga_sprs_array_row_distribution(local_c8,local_d8,&ilo,&ihi);
  buf = (undefined8 *)malloc(((ihi - ilo) + 1) * *(long *)((long)&SPA->size + lVar20));
  if (local_e0 < 1) {
    local_e0 = 0;
  }
  local_130 = 1;
  lVar25 = 0;
  do {
    IVar17 = local_c8;
    if (lVar25 == local_e0) {
      if (ilo <= ihi) {
        klo = ilo + 1;
        khi = ihi + 1;
        pnga_acc(local_c0,&klo,&khi,buf,&one,&one_r);
      }
      if ((int)local_b0 != 0) {
        pnga_pgroup_sync(local_b8);
      }
      free(buf);
      return;
    }
    pnga_sprs_array_column_distribution(local_c8,lVar25,&jlo,&jhi);
    local_d8 = lVar25;
    if ((int)local_a8 == 4) {
      pnga_sprs_array_access_col_block(IVar17,lVar25,&iptr,&jptr,&vptr);
      pvVar15 = vptr;
      IVar14 = jlo;
      IVar17 = jhi;
      if (vptr != (void *)0x0) {
        switch(*(undefined8 *)((long)&SPA->type + local_e8)) {
        case 0x3e9:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 4 + 4);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *(undefined4 *)puVar16 = 0;
              puVar16 = (undefined8 *)((long)puVar16 + 4);
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            for (uVar22 = 0; IVar17 = lVar25, uVar19 != uVar22; uVar22 = uVar22 + 1) {
              piVar2 = (int *)((long)buf + lVar18 * 4);
              *piVar2 = *piVar2 + *(int *)((long)buf_00 + (jptr[(long)iVar8 + uVar22] - IVar14) * 4)
                                  * *(int *)((long)pvVar15 + uVar22 * 4 + (long)iVar8 * 4);
            }
          }
          break;
        case 0x3ea:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            for (uVar22 = 0; IVar17 = lVar25, uVar19 != uVar22; uVar22 = uVar22 + 1) {
              buf[lVar18] = buf[lVar18] +
                            *(long *)((long)buf_00 + (jptr[(long)iVar8 + uVar22] - IVar14) * 8) *
                            *(long *)((long)pvVar15 + uVar22 * 8 + (long)iVar8 * 8);
            }
          }
          break;
        case 0x3eb:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 4 + 4);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *(undefined4 *)puVar16 = 0;
              puVar16 = (undefined8 *)((long)puVar16 + 4);
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            for (uVar22 = 0; IVar17 = lVar25, uVar19 != uVar22; uVar22 = uVar22 + 1) {
              *(float *)((long)buf + lVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar22 * 4 + (long)iVar8 * 4) *
                   *(float *)((long)buf_00 + (jptr[(long)iVar8 + uVar22] - IVar14) * 4) +
                   *(float *)((long)buf + lVar18 * 4);
            }
          }
          break;
        case 0x3ec:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            for (uVar22 = 0; IVar17 = lVar25, uVar19 != uVar22; uVar22 = uVar22 + 1) {
              buf[lVar18] = *(double *)((long)pvVar15 + uVar22 * 8 + (long)iVar8 * 8) *
                            *(double *)((long)buf_00 + (jptr[(long)iVar8 + uVar22] - IVar14) * 8) +
                            (double)buf[lVar18];
            }
          }
          break;
        default:
          goto switchD_0014712f_caseD_3ed;
        case 0x3ee:
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = IVar17 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            lVar20 = (long)iVar8 * 8;
            for (uVar22 = 0; IVar17 = lVar25, uVar19 != uVar22; uVar22 = uVar22 + 1) {
              fVar3 = *(float *)((long)buf_00 + uVar22 * 8 + lVar20);
              fVar4 = *(float *)((long)buf_00 + uVar22 * 8 + lVar20 + 4);
              uVar7 = *(undefined8 *)((long)buf_00 + (jptr[(long)iVar8 + uVar22] - IVar14) * 8);
              fVar26 = (float)uVar7;
              fVar27 = (float)((ulong)uVar7 >> 0x20);
              buf[lVar18] = CONCAT44(fVar3 * fVar27 + fVar26 * fVar4,
                                     fVar3 * fVar26 + fVar27 * -fVar4);
            }
          }
          break;
        case 0x3ef:
          buf_00 = malloc((jhi - jlo) * 0x10 + 0x10);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16[1] = 0;
              puVar16 = puVar16 + 2;
            }
          }
          klo = IVar14 + 1;
          khi = IVar17 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            lVar20 = (long)iVar8 * 0x10;
            for (lVar24 = 0; IVar17 = lVar25, uVar19 * 4 != lVar24; lVar24 = lVar24 + 4) {
              dVar5 = *(double *)((long)buf_00 + lVar24 * 4 + lVar20);
              dVar6 = *(double *)((long)buf_00 + lVar24 * 4 + lVar20 + 8);
              pdVar21 = (double *)
                        ((long)buf_00 +
                        (*(int *)((long)jptr + lVar24 + (long)iVar8 * 4) - IVar14) * 0x10);
              dVar12 = *pdVar21;
              dVar13 = pdVar21[1];
              dVar11 = dVar5 * dVar13 + dVar12 * dVar6;
              auVar9._8_4_ = SUB84(dVar11,0);
              auVar9._0_8_ = dVar5 * dVar12 + dVar13 * -dVar6;
              auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
              *(undefined1 (*) [16])(buf + lVar18 * 2) = auVar9;
            }
          }
          break;
        case 0x3f8:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar18 = IVar17 - ilo;
            iVar8 = iptr[lVar18];
            uVar19 = (ulong)(uint)(iptr[lVar25 - ilo] - iVar8);
            if (iptr[lVar25 - ilo] - iVar8 < 1) {
              uVar19 = 0;
            }
            for (uVar22 = 0; IVar17 = lVar25, uVar19 != uVar22; uVar22 = uVar22 + 1) {
              buf[lVar18] = buf[lVar18] +
                            *(long *)((long)buf_00 + (jptr[(long)iVar8 + uVar22] - IVar14) * 8) *
                            *(long *)((long)pvVar15 + uVar22 * 8 + (long)iVar8 * 8);
            }
          }
        }
LAB_00147ed7:
        free(buf_00);
        local_130 = 0;
      }
    }
    else {
      pnga_sprs_array_access_col_block(IVar17,lVar25,&ilptr,&jlptr,&vptr);
      pvVar15 = vptr;
      IVar14 = jlo;
      IVar17 = jhi;
      if (vptr != (void *)0x0) {
        switch(*(undefined8 *)((long)&SPA->type + local_e8)) {
        case 0x3e9:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 4 + 4);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *(undefined4 *)puVar16 = 0;
              puVar16 = (undefined8 *)((long)puVar16 + 4);
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              piVar2 = (int *)((long)buf + lVar20 * 4);
              *piVar2 = *piVar2 + *(int *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 4) *
                                  *(int *)((long)pvVar15 + lVar23 * 4 + lVar18 * 4);
            }
          }
          break;
        case 0x3ea:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              buf[lVar20] = buf[lVar20] +
                            *(long *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 8) *
                            *(long *)((long)pvVar15 + lVar23 * 8 + lVar18 * 8);
            }
          }
          break;
        case 0x3eb:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 4 + 4);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *(undefined4 *)puVar16 = 0;
              puVar16 = (undefined8 *)((long)puVar16 + 4);
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              *(float *)((long)buf + lVar20 * 4) =
                   *(float *)((long)pvVar15 + lVar23 * 4 + lVar18 * 4) *
                   *(float *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 4) +
                   *(float *)((long)buf + lVar20 * 4);
            }
          }
          break;
        case 0x3ec:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              buf[lVar20] = *(double *)((long)pvVar15 + lVar23 * 8 + lVar18 * 8) *
                            *(double *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 8) +
                            (double)buf[lVar20];
            }
          }
          break;
        default:
          goto switchD_0014712f_caseD_3ed;
        case 0x3ee:
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = IVar17 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              fVar3 = *(float *)((long)buf_00 + lVar23 * 8 + lVar18 * 8);
              fVar4 = *(float *)((long)buf_00 + lVar23 * 8 + lVar18 * 8 + 4);
              uVar7 = *(undefined8 *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 8);
              fVar26 = (float)uVar7;
              fVar27 = (float)((ulong)uVar7 >> 0x20);
              buf[lVar20] = CONCAT44(fVar3 * fVar27 + fVar26 * fVar4,
                                     fVar3 * fVar26 + fVar27 * -fVar4);
            }
          }
          break;
        case 0x3ef:
          buf_00 = malloc((jhi - jlo) * 0x10 + 0x10);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16[1] = 0;
              puVar16 = puVar16 + 2;
            }
          }
          klo = IVar14 + 1;
          khi = IVar17 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            pdVar21 = (double *)((long)buf_00 + lVar18 * 0x10 + 8);
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              pdVar1 = (double *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 0x10);
              dVar6 = *pdVar1;
              dVar11 = pdVar1[1];
              dVar5 = pdVar21[-1] * dVar11 + dVar6 * *pdVar21;
              auVar10._8_4_ = SUB84(dVar5,0);
              auVar10._0_8_ = pdVar21[-1] * dVar6 + dVar11 * -*pdVar21;
              auVar10._12_4_ = (int)((ulong)dVar5 >> 0x20);
              *(undefined1 (*) [16])(buf + lVar20 * 2) = auVar10;
              pdVar21 = pdVar21 + 2;
            }
          }
          break;
        case 0x3f8:
          local_138 = jhi;
          buf_00 = malloc((jhi - jlo) * 8 + 8);
          puVar16 = buf;
          lVar25 = ilo;
          if (local_130 != 0) {
            for (; lVar25 <= ihi; lVar25 = lVar25 + 1) {
              *puVar16 = 0;
              puVar16 = puVar16 + 1;
            }
          }
          klo = IVar14 + 1;
          khi = local_138 + 1;
          pnga_get(local_128,&klo,&khi,buf_00,&one);
          IVar17 = ilo;
          while (IVar17 <= ihi) {
            lVar25 = IVar17 + 1;
            lVar20 = IVar17 - ilo;
            lVar18 = ilptr[lVar20];
            lVar24 = ilptr[lVar25 - ilo] - lVar18;
            if (lVar24 < 1) {
              lVar24 = 0;
            }
            for (lVar23 = 0; IVar17 = lVar25, lVar24 != lVar23; lVar23 = lVar23 + 1) {
              buf[lVar20] = buf[lVar20] +
                            *(long *)((long)buf_00 + (jlptr[lVar18 + lVar23] - IVar14) * 8) *
                            *(long *)((long)pvVar15 + lVar23 * 8 + lVar18 * 8);
            }
          }
        }
        goto LAB_00147ed7;
      }
    }
switchD_0014712f_caseD_3ed:
    lVar25 = local_d8 + 1;
  } while( true );
}

Assistant:

void pnga_sprs_array_matvec_multiply(Integer s_a, Integer g_a, Integer g_v)
{
  Integer s_hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer s_grp = SPA[s_hdl].grp;
  Integer me = pnga_pgroup_nodeid(s_grp);
  Integer nproc = pnga_pgroup_nnodes(s_grp);

  Integer ilo, ihi, jlo, jhi, klo, khi;
  void  *vsum, *vptr;
  int idx_size = SPA[s_hdl].idx_size;
  int64_t *ilptr = NULL, *jlptr = NULL;
  int *iptr = NULL, *jptr = NULL;
  Integer i, j, iproc, ncols;
  double one_r = 1.0;
  Integer one = 1;
  Integer adim, vdim, arank, vrank, dims[GA_MAX_DIM];
  Integer atype, vtype;
  Integer zflag;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(s_grp);
  /* Check that g_hdl and v_hdl are both vectors and that sizes
   * match */
  pnga_inquire(g_a, &atype, &arank, dims);
  adim = dims[0];
  pnga_inquire(g_v, &vtype, &vrank, dims);
  vdim = dims[0];
  if (arank != 1) pnga_error("rank of A must be 1 (vector)",arank);
  if (vrank != 1) pnga_error("rank of V must be 1 (vector)",vrank);
  if (adim != SPA[s_hdl].jdim) {
    pnga_error("length of A must equal second dimension of sparse matrix",adim);
  }
  if (vdim != SPA[s_hdl].jdim) {
    pnga_error("length of V must equal second dimension of sparse matrix",vdim);
  }
  if (atype != SPA[s_hdl].type || vtype != SPA[s_hdl].type) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",
        SPA[s_hdl].type);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   * data type encountered */
  if (SPA[s_hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix and A and V vectors"
        " cannot be of type long long",SPA[s_hdl].type);
  }


#define SPRS_REAL_MULTIPLY_M(_type,_iptr,_jptr)              \
  {                                                          \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                              \
    _type *_ptr = (_type*)vptr;                              \
    if (zflag) {                                             \
      for (i=ilo; i<=ihi; i++) {                             \
        _sum[i-ilo] = (_type)0;                              \
      }                                                      \
      zflag = 0;                                             \
    }                                                        \
    klo = jlo+1;                                             \
    khi = jhi+1;                                             \
    pnga_get(g_a,&klo,&khi,_buf,&one);                       \
    for (i=ilo; i<=ihi; i++) {                               \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                   \
      for (j=0; j<ncols; j++) {                              \
        _sum[i-ilo] += _ptr[_iptr[i-ilo]+j]                  \
                     * _buf[_jptr[_iptr[i-ilo]+j]-jlo];      \
      }                                                      \
    }                                                        \
    free(_buf);                                              \
  }
  
#define SPRS_COMPLEX_MULTIPLY_M(_type,_iptr,_jptr)             \
  {                                                            \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*2*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                                \
    _type *_ptr = (_type*)vptr;                                \
    _type rbuf,ibuf,rval,ival;                                 \
    if (zflag) {                                               \
      for (i=ilo; i<=ihi; i++) {                               \
        _sum[2*(i-ilo)] = 0.0;                                 \
        _sum[2*(i-ilo)+1] = 0.0;                               \
      }                                                        \
      zflag = 0;                                               \
    }                                                          \
    klo = jlo+1;                                               \
    khi = jhi+1;                                               \
    pnga_get(g_a,&klo,&khi,_buf,&one);                         \
    for (i=ilo; i<=ihi; i++) {                                 \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                     \
      for (j=0; j<ncols; j++) {                                \
            rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];        \
            ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];      \
            rval = _buf[2*(_iptr[i-ilo]+j)];                   \
            ival = _buf[2*(_iptr[i-ilo]+j)+1];                 \
            _sum[2*(i-ilo)] = rval*rbuf-ival*ibuf;             \
            _sum[2*(i-ilo)+1] = rval*ibuf+ival*rbuf;           \
      }                                                        \
    }                                                          \
    free(_buf);                                                \
  }
  
  /* Make sure product vector is zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  /* multiply sparse matrix by sparse vector */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vsum = (void*)malloc((ihi-ilo+1)*SPA[s_hdl].size);
  zflag = 1;
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,iptr,jptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
  }
#undef SPRS_REAL_MULTIPLY_M
#undef SPRS_COMPLEX_MULTIPLY_M

  if (ihi>=ilo) {
    klo = ilo + 1;
    khi = ihi + 1;
    pnga_acc(g_v,&klo,&khi,vsum,&one,&one_r);
  }
  if (local_sync_end)  pnga_pgroup_sync(s_grp);
  free(vsum);
}